

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::Image::CreateImageGLES2::CreateImageGLES2
          (CreateImageGLES2 *this,EglTestContext *eglTestCtx,EGLint target,GLenum internalFormat,
          GLenum format,GLenum type,bool useTexLevel0)

{
  PtrData<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_> data;
  char *pcVar1;
  CreateImageGLES2 *this_00;
  uint uVar2;
  undefined4 in_stack_fffffffffffffe8c;
  PtrData<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>
  local_130;
  PtrData<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>
  *local_120;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  ApiType local_30;
  byte local_29;
  GLenum local_28;
  GLenum GStack_24;
  bool useTexLevel0_local;
  GLenum type_local;
  GLenum format_local;
  GLenum internalFormat_local;
  EGLint target_local;
  EglTestContext *eglTestCtx_local;
  CreateImageGLES2 *this_local;
  
  local_29 = useTexLevel0;
  local_28 = type;
  GStack_24 = format;
  type_local = internalFormat;
  format_local = target;
  _internalFormat_local = eglTestCtx;
  eglTestCtx_local = (EglTestContext *)this;
  local_30 = glu::ApiType::es(2,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"create_image_gles2_",&local_d1);
  pcVar1 = getTargetName(format_local);
  std::operator+(&local_b0,&local_d0,pcVar1);
  std::operator+(&local_90,&local_b0,"_");
  pcVar1 = getStorageName(type_local);
  std::operator+(&local_70,&local_90,pcVar1);
  pcVar1 = "";
  if ((local_29 & 1) != 0) {
    pcVar1 = "_level0_only";
  }
  std::operator+(&local_50,&local_70,pcVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"Create EGLImage from GLES2 object",&local_109);
  ImageTestCase::ImageTestCase(&this->super_ImageTestCase,eglTestCtx,local_30,&local_50,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  (this->super_ImageTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__CreateImageGLES2_0326d120;
  uVar2 = local_29 & 1;
  this_00 = this;
  getImageSource((MovePtr<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>
                  *)&local_130,this,format_local,type_local,GStack_24,local_28,SUB41(uVar2,0));
  local_120 = de::details::MovePtr::operator_cast_to_PtrData(&local_130,(MovePtr *)this_00);
  data.ptr._4_4_ = in_stack_fffffffffffffe8c;
  data.ptr._0_4_ = uVar2;
  data._8_8_ = local_120;
  de::details::
  UniquePtr<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>::
  UniquePtr(&this->m_source,data);
  de::details::
  MovePtr<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>::
  ~MovePtr((MovePtr<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>
            *)&local_130);
  this->m_internalFormat = type_local;
  return;
}

Assistant:

CreateImageGLES2 (EglTestContext& eglTestCtx, EGLint target, GLenum internalFormat, GLenum format, GLenum type, bool useTexLevel0 = false)
		: ImageTestCase		(eglTestCtx, ApiType::es(2, 0), string("create_image_gles2_") + getTargetName(target) + "_" + getStorageName(internalFormat) + (useTexLevel0 ? "_level0_only" : ""), "Create EGLImage from GLES2 object")
		, m_source			(getImageSource(target, internalFormat, format, type, useTexLevel0))
		, m_internalFormat	(internalFormat)
	{
	}